

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_196f0::IDLExportVisitor::visit_
          (IDLExportVisitor *this,Compound *type,Field *field)

{
  ostream *poVar1;
  Type *type_00;
  string local_68;
  string local_48;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->m_stream,(this->m_indent)._M_dataplus._M_p,
                      (this->m_indent)._M_string_length);
  type_00 = (Type *)Typelib::Field::getType();
  Typelib::Field::getName_abi_cxx11_();
  getIDLAbsolute(&local_68,type_00,this->m_exporter,&local_48);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,";\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool IDLExportVisitor::visit_(Compound const& type, Field const& field)
    {
        m_stream
            << m_indent
            << getIDLAbsolute(field.getType(), field.getName())
            << ";\n";

        return true;
    }